

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_removeAllComponentsImportedChild_Test::TestBody
          (Model_removeAllComponentsImportedChild_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ModelPtr model;
  ComponentPtr c2;
  ImportSourcePtr import;
  ComponentPtr c1;
  long *local_80;
  unsigned_long local_78;
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long local_30 [2];
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"c1","");
  libcellml::Component::create(local_20);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"c2","");
  libcellml::Component::create((string *)&local_50);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  libcellml::ImportSource::create();
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_50 + 0x10));
  libcellml::ComponentEntity::addComponent(local_60);
  libcellml::ComponentEntity::addComponent(local_60);
  local_80 = (long *)0x2;
  local_78 = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_70,"size_t(2)","model->componentCount()",(unsigned_long *)&local_80,&local_78);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x489,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_80 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::ComponentEntity::removeAllComponents();
  local_80 = (long *)0x0;
  local_78 = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_70,"size_t(0)","model->componentCount()",(unsigned_long *)&local_80,&local_78);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x48c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_80 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

TEST(Model, removeAllComponentsImportedChild)
{
    auto model = libcellml::Model::create();
    auto c1 = libcellml::Component::create("c1");
    auto c2 = libcellml::Component::create("c2");
    auto import = libcellml::ImportSource::create();
    c2->setImportSource(import);
    model->addComponent(c2);
    model->addComponent(c1);
    EXPECT_EQ(size_t(2), model->componentCount());

    model->removeAllComponents();
    EXPECT_EQ(size_t(0), model->componentCount());
}